

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::checkTimeStep(PeleLM *this,Real a_time,Real a_dt)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  int iVar8;
  Real RVar9;
  Real RVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double *pdVar16;
  Long LVar17;
  Long LVar18;
  Long LVar19;
  int iVar20;
  int iVar21;
  double *pdVar22;
  Long LVar23;
  Long LVar24;
  int iVar25;
  int iVar26;
  double *pdVar27;
  Long LVar28;
  Long LVar29;
  int iVar30;
  int iVar31;
  double *pdVar32;
  Long LVar33;
  Long LVar34;
  double *pdVar35;
  Long LVar36;
  Long LVar37;
  int iVar38;
  double *pdVar39;
  Long LVar40;
  Long LVar41;
  int iVar42;
  int iVar43;
  double *pdVar44;
  Long LVar45;
  Long LVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  uint uVar50;
  int iVar51;
  uint uVar52;
  int iVar53;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  uint uVar73;
  uint uVar74;
  long lVar75;
  uint uVar76;
  long lVar77;
  int iVar78;
  char *__format;
  int iVar79;
  long lVar80;
  int iVar81;
  uint uVar82;
  bool bVar83;
  double dVar84;
  double dVar85;
  MFIter mfi;
  ulong local_560;
  Box local_26c;
  Array4<const_double> local_250;
  Array4<const_double> local_210;
  Array4<const_double> local_1d0;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  if ((NavierStokesBase::fixed_dt <= 0.0) && (divu_ceiling != 0)) {
    this_00 = &amrex::AmrLevel::get_data((AmrLevel *)this,NavierStokesBase::Divu_Type,a_time)->
               super_FabArray<amrex::FArrayBox>;
    this_01 = &amrex::AmrLevel::get_data((AmrLevel *)this,0,a_time)->
               super_FabArray<amrex::FArrayBox>;
    amrex::MFIter::MFIter(&local_90,&this_01->super_FabArrayBase,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        amrex::MFIter::tilebox(&local_26c,&local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_d0,
                   &(this->super_NavierStokesBase).rho_ctime.super_FabArray<amrex::FArrayBox>,
                   &local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_250,this_01,&local_90,0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,this_00,&local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_150,
                   &(this->super_NavierStokesBase).volume.super_FabArray<amrex::FArrayBox>,&local_90
                  );
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_190,
                   (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x540,
                   &local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1d0,
                   (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x6c0,
                   &local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_210,
                   (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x840,
                   &local_90);
        iVar48 = local_d0.begin.z;
        iVar47 = local_d0.begin.y;
        LVar46 = local_d0.kstride;
        LVar45 = local_d0.jstride;
        pdVar44 = local_d0.p;
        iVar43 = local_110.begin.z;
        iVar42 = local_110.begin.y;
        LVar41 = local_110.kstride;
        LVar40 = local_110.jstride;
        pdVar39 = local_110.p;
        iVar38 = local_150.begin.x;
        LVar37 = local_150.kstride;
        LVar36 = local_150.jstride;
        pdVar35 = local_150.p;
        LVar34 = local_190.kstride;
        LVar33 = local_190.jstride;
        pdVar32 = local_190.p;
        iVar31 = local_1d0.begin.y;
        iVar30 = local_1d0.begin.x;
        LVar29 = local_1d0.kstride;
        LVar28 = local_1d0.jstride;
        pdVar27 = local_1d0.p;
        iVar26 = local_210.begin.z;
        iVar25 = local_210.begin.x;
        LVar24 = local_210.kstride;
        LVar23 = local_210.jstride;
        pdVar22 = local_210.p;
        iVar21 = local_250.begin.z;
        iVar20 = local_250.begin.y;
        LVar19 = local_250.nstride;
        LVar18 = local_250.kstride;
        LVar17 = local_250.jstride;
        pdVar16 = local_250.p;
        iVar15 = local_26c.bigend.vect[2];
        iVar14 = local_26c.bigend.vect[1];
        iVar13 = local_26c.bigend.vect[0];
        iVar12 = local_26c.smallend.vect[1];
        iVar11 = local_26c.smallend.vect[0];
        RVar10 = min_rho_divu_ceiling;
        RVar9 = divu_dt_factor;
        iVar8 = divu_ceiling;
        if (local_26c.smallend.vect[2] <= local_26c.bigend.vect[2]) {
          dVar3 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[0];
          dVar4 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[1];
          dVar5 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[2];
          uVar73 = ~local_d0.begin.x;
          uVar49 = ~local_d0.begin.y;
          uVar50 = ~local_d0.begin.z;
          iVar81 = -local_d0.begin.x;
          iVar78 = -local_110.begin.x;
          iVar51 = -local_250.begin.x;
          iVar79 = -local_190.begin.x;
          uVar76 = ~local_250.begin.x;
          lVar58 = (long)local_150.begin.y;
          lVar59 = (long)local_150.begin.z;
          lVar60 = (long)local_190.begin.y;
          lVar61 = (long)local_190.begin.z;
          lVar62 = (long)local_1d0.begin.z;
          lVar63 = (long)local_210.begin.y;
          uVar52 = local_26c.bigend.vect[0] + 1;
          uVar7 = local_26c.smallend.vect[2];
          do {
            local_560 = (ulong)uVar7;
            if (iVar12 <= iVar14) {
              iVar53 = uVar7 + 1;
              lVar80 = (int)(uVar7 - iVar48) * LVar46;
              lVar75 = (int)(uVar7 - iVar21) * LVar18;
              lVar64 = (iVar53 - iVar48) * LVar46;
              lVar65 = (long)(int)uVar7;
              lVar69 = (lVar65 - lVar61) * LVar34;
              lVar70 = (lVar65 - lVar62) * LVar29;
              lVar54 = (int)(uVar7 - iVar43) * LVar41;
              uVar82 = iVar12;
              do {
                if (iVar11 <= iVar13) {
                  iVar1 = uVar82 + 1;
                  lVar55 = (int)(uVar82 - iVar47) * LVar45;
                  lVar56 = (int)(uVar82 - iVar20) * LVar17;
                  lVar71 = (iVar1 - iVar47) * LVar45;
                  lVar72 = (long)(int)uVar82;
                  lVar77 = (lVar72 - lVar60) * LVar33;
                  lVar66 = (lVar72 - lVar63) * LVar23;
                  lVar67 = (int)(uVar82 - iVar42) * LVar40;
                  uVar74 = iVar11;
                  do {
                    lVar68 = (long)(int)(iVar81 + uVar74);
                    dVar6 = pdVar44[lVar55 + lVar68 + lVar80];
                    if (iVar8 == 3) {
                      lVar57 = (long)(int)(iVar51 + uVar74);
                      pdVar2 = pdVar16 + lVar56 + lVar57 + lVar75;
                      dVar85 = (((pdVar2[LVar19 * 2] +
                                 pdVar16[lVar56 + lVar57 + (iVar53 - iVar21) * LVar18 + LVar19 * 2])
                                 * (pdVar44[lVar55 + lVar68 + lVar64] + dVar6) * 0.25 *
                                 pdVar22[lVar66 + (long)(int)(uVar74 - iVar25) +
                                                  (iVar53 - iVar26) * LVar24] +
                                (((pdVar2[LVar19] +
                                  pdVar16[LVar19 + lVar75 + (iVar1 - iVar20) * LVar17 + lVar57]) *
                                  (pdVar44[lVar80 + lVar71 + lVar68] + dVar6) * 0.25 *
                                  pdVar27[lVar70 + (iVar1 - iVar31) * LVar28 +
                                                   (long)(int)(uVar74 - iVar30)] +
                                 ((*pdVar2 + pdVar16[lVar56 + lVar75 + (int)(iVar51 + 1 + uVar74)])
                                  * (pdVar44[lVar55 + lVar80 + (int)(iVar81 + 1 + uVar74)] + dVar6)
                                  * 0.25 * pdVar32[lVar77 + lVar69 + (int)(iVar79 + 1 + uVar74)] -
                                 (pdVar16[lVar56 + lVar75 + (int)(uVar76 + uVar74)] + *pdVar2) *
                                 (pdVar44[lVar55 + lVar80 + (int)(uVar73 + uVar74)] + dVar6) * 0.25
                                 * pdVar32[lVar77 + lVar69 + (int)(iVar79 + uVar74)])) -
                                (pdVar16[LVar19 + lVar75 + (int)((uVar82 - 1) - iVar20) * LVar17 +
                                                           lVar57] + pdVar2[LVar19]) *
                                (pdVar44[lVar80 + (int)((uVar82 - 1) - iVar47) * LVar45 + lVar68] +
                                dVar6) * 0.25 *
                                pdVar27[lVar70 + (int)(uVar82 - iVar31) * LVar28 +
                                                 (long)(int)(uVar74 - iVar30)])) -
                               (pdVar16[lVar56 + lVar57 + (int)((uVar7 - 1) - iVar21) * LVar18 +
                                                          LVar19 * 2] + pdVar2[LVar19 * 2]) *
                               (pdVar44[lVar55 + lVar68 + (int)((uVar7 - 1) - iVar48) * LVar46] +
                               dVar6) * 0.25 *
                               pdVar22[lVar66 + (long)(int)(uVar74 - iVar25) +
                                                (int)(uVar7 - iVar26) * LVar24]) /
                               pdVar35[(lVar65 - lVar59) * LVar37 +
                                       (lVar72 - lVar58) * LVar36 + (long)(int)(uVar74 - iVar38)];
LAB_002623da:
                      dVar84 = 1000000000000.0;
                      if (0.0 < dVar85) {
                        dVar84 = (double)(~-(ulong)(RVar10 < dVar6) & (ulong)ABS(dVar6) |
                                         (ulong)(dVar6 - RVar10) & -(ulong)(RVar10 < dVar6));
LAB_00262417:
                        dVar84 = dVar84 / dVar85;
                      }
                    }
                    else {
                      if (iVar8 == 2) {
                        lVar57 = (long)(int)(iVar51 + uVar74);
                        dVar85 = (pdVar44[lVar55 + lVar68 + lVar64] -
                                 pdVar44[lVar55 + lVar68 + (int)(uVar50 + uVar7) * LVar46]) *
                                 pdVar16[lVar75 + lVar56 + lVar57 + LVar19 * 2] * dVar5 +
                                 (pdVar44[lVar80 + lVar71 + lVar68] -
                                 pdVar44[lVar80 + (int)(uVar49 + uVar82) * LVar45 + lVar68]) *
                                 pdVar16[lVar75 + lVar56 + lVar57 + LVar19] * dVar4 +
                                 pdVar39[lVar54 + lVar67 + (int)(iVar78 + uVar74)] * dVar6 +
                                 (pdVar44[lVar55 + lVar80 + (int)(iVar81 + uVar74 + 1)] -
                                 pdVar44[lVar55 + lVar80 + (int)(uVar73 + uVar74)]) *
                                 pdVar16[lVar75 + lVar56 + lVar57] * dVar3;
                        goto LAB_002623da;
                      }
                      dVar84 = 1000000000000.0;
                      if (iVar8 == 1) {
                        dVar85 = pdVar39[lVar54 + lVar67 + (int)(iVar78 + uVar74)];
                        dVar84 = 1000000000000.0;
                        if (dVar85 <= 0.0) goto LAB_0026241b;
                        if (dVar6 <= RVar10) {
                          dVar84 = 1.0;
                        }
                        else {
                          dVar84 = 1.0 - RVar10 / dVar6;
                        }
                        goto LAB_00262417;
                      }
                    }
LAB_0026241b:
                    if (a_dt <= dVar84) {
                      if (dVar84 * RVar9 < a_dt) {
                        __format = 
                        " WARNING: check_divu_dt - [%i,%i,%i] dtcell*dtfactor %f8.6 > dt %f8.6";
                        goto LAB_00262440;
                      }
                    }
                    else {
                      __format = " ERROR: check_divu_dt - [%i,%i,%i] dtcell %f8.6 > dt %f8.6";
LAB_00262440:
                      printf(__format,(ulong)uVar74,(ulong)uVar82,local_560);
                    }
                    uVar74 = uVar74 + 1;
                  } while (uVar52 != uVar74);
                }
                bVar83 = uVar82 != iVar14;
                uVar82 = uVar82 + 1;
              } while (bVar83);
            }
            bVar83 = uVar7 != iVar15;
            uVar7 = uVar7 + 1;
          } while (bVar83);
        }
        amrex::MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    amrex::MFIter::~MFIter(&local_90);
  }
  return;
}

Assistant:

void
PeleLM::checkTimeStep (const Real a_time,
                       Real a_dt)
{
   BL_PROFILE("PLM::checkTimeStep()");

   if (fixed_dt > 0.0 || !divu_ceiling) {
      return;
   }

   // Get class state data refs. We assume it's been FillPatched already !
   const MultiFab& divU = get_data(Divu_Type,a_time);
   const MultiFab& S    = get_data(State_Type,a_time);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      const Box&  bx   = mfi.tilebox();
      auto const& rho  = rho_ctime.const_array(mfi);
      auto const& vel  = S.const_array(mfi,0);
      auto const& divu = divU.const_array(mfi);
      auto const& vol  = volume.const_array(mfi);
      AMREX_D_TERM(auto const& areax = (area[0]).const_array(mfi);,
                   auto const& areay = (area[1]).const_array(mfi);,
                   auto const& areaz = (area[2]).const_array(mfi););
      int  divu_check_flag = divu_ceiling;
      Real divu_dt_fac     = divu_dt_factor;
      Real rho_min         = min_rho_divu_ceiling;
      const auto dxinv     = geom.InvCellSizeArray();

      amrex::ParallelFor(bx, [rho, vel, divu, vol, AMREX_D_DECL(areax,areay,areaz),
                              divu_check_flag, divu_dt_fac, rho_min, dxinv, a_dt]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         check_divu_dt(i, j, k, divu_check_flag, divu_dt_fac, rho_min, dxinv,
                       rho, vel, divu, vol, AMREX_D_DECL(areax,areay,areaz), a_dt);
      });
   }
}